

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteInitExpr(CWriter *this,ExprList *expr_list)

{
  string_view s;
  pointer this_00;
  bool bVar1;
  ExprType EVar2;
  Enum EVar3;
  reference this_01;
  OpcodeExpr<(wabt::ExprType)7> *pOVar4;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  const_iterator rhs;
  size_type local_268;
  uchar *local_260;
  OutputBuffer *local_258;
  OutputBuffer *buf;
  MemoryStream terminal_stream;
  Stream *existing_stream;
  Type local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1e9;
  Type local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string combination;
  char op;
  OpcodeExpr<(wabt::ExprType)7> *binexpr;
  Expr *expr;
  const_iterator __end2;
  const_iterator __begin2;
  ExprList *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mini_stack;
  ExprList *expr_list_local;
  CWriter *this_local;
  
  mini_stack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)expr_list;
  bVar1 = intrusive_list<wabt::Expr>::empty(expr_list);
  if (bVar1) {
    abort();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  this_00 = mini_stack.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  join_0x00000010_0x00000000_ =
       intrusive_list<wabt::Expr>::begin
                 ((intrusive_list<wabt::Expr> *)
                  mini_stack.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  rhs = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)this_00);
  do {
    bVar1 = intrusive_list<wabt::Expr>::const_iterator::operator!=
                      ((const_iterator *)&__end2.node_,rhs);
    if (!bVar1) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      if (sVar6 != 1) {
        abort();
      }
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar7);
      Write(this,s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
      return;
    }
    this_01 = intrusive_list<wabt::Expr>::const_iterator::operator*((const_iterator *)&__end2.node_)
    ;
    EVar2 = Expr::type(this_01);
    if (EVar2 == Binary) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      if (sVar6 < 2) {
        abort();
      }
      pOVar4 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(this_01);
      EVar3 = Opcode::operator_cast_to_Enum(&pOVar4->opcode);
      if (EVar3 == I32Add) {
LAB_001df002:
        combination.field_2._M_local_buf[0xf] = '+';
      }
      else if (EVar3 == I32Sub) {
LAB_001df008:
        combination.field_2._M_local_buf[0xf] = '-';
      }
      else {
        if (EVar3 != I32Mul) {
          if (EVar3 == I64Add) goto LAB_001df002;
          if (EVar3 == I64Sub) goto LAB_001df008;
          if (EVar3 != I64Mul) {
            if (EVar3 == F32Add) goto LAB_001df002;
            if (EVar3 == F32Sub) goto LAB_001df008;
            if (EVar3 != F32Mul) {
              if (EVar3 == F64Add) goto LAB_001df002;
              if (EVar3 == F64Sub) goto LAB_001df008;
              if (EVar3 != F64Mul) {
                abort();
              }
            }
          }
        }
        combination.field_2._M_local_buf[0xf] = '*';
      }
      local_1e8 = Opcode::GetParamType1(&pOVar4->opcode);
      pcVar5 = GetCTypeName(&local_1e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar5,&local_1e9);
      std::operator+(&local_1c0,"((",&local_1e0);
      std::operator+(&local_1a0,&local_1c0,")");
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2,sVar6 - 2);
      std::operator+(&local_180,&local_1a0,pvVar7);
      std::operator+(&local_160,&local_180,")");
      std::operator+(&local_140,&local_160,combination.field_2._M_local_buf[0xf]);
      std::operator+(&local_120,&local_140,"((");
      local_218 = Opcode::GetParamType2(&pOVar4->opcode);
      pcVar5 = GetCTypeName(&local_218);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,pcVar5,(allocator<char> *)((long)&existing_stream + 7));
      std::operator+(&local_100,&local_120,&local_210);
      std::operator+(&local_e0,&local_100,")");
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2,sVar6 - 1);
      std::operator+(&local_c0,&local_e0,pvVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_c0,")");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)((long)&existing_stream + 7));
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e9);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,sVar6 - 2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,(value_type *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      terminal_stream.buf_._M_t.
      super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
      super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
      super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>,_true,_true>
           )this->stream_;
      MemoryStream::MemoryStream((MemoryStream *)&buf,(Stream *)0x0);
      this->stream_ = (Stream *)&buf;
      WriteInitExprTerminal(this,this_01);
      local_258 = MemoryStream::output_buffer((MemoryStream *)&buf);
      local_260 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&local_258->data)
      ;
      local_268 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_258->data)
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,unsigned_long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                 (char **)&local_260,&local_268);
      this->stream_ =
           (Stream *)
           terminal_stream.buf_._M_t.
           super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
           super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
           super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
      MemoryStream::~MemoryStream((MemoryStream *)&buf);
    }
    intrusive_list<wabt::Expr>::const_iterator::operator++((const_iterator *)&__end2.node_);
  } while( true );
}

Assistant:

void CWriter::WriteInitExpr(const ExprList& expr_list) {
  if (expr_list.empty()) {
    WABT_UNREACHABLE;
  }

  std::vector<std::string> mini_stack;

  for (const auto& expr : expr_list) {
    if (expr.type() == ExprType::Binary) {
      // Extended const expressions include at least one binary op.
      // This builds a C expression from the operands.
      if (mini_stack.size() < 2) {
        WABT_UNREACHABLE;
      }

      const auto binexpr = cast<BinaryExpr>(&expr);
      char op;
      switch (binexpr->opcode) {
        case Opcode::I32Add:
        case Opcode::I64Add:
        case Opcode::F32Add:
        case Opcode::F64Add:
          op = '+';
          break;

        case Opcode::I32Sub:
        case Opcode::I64Sub:
        case Opcode::F32Sub:
        case Opcode::F64Sub:
          op = '-';
          break;

        case Opcode::I32Mul:
        case Opcode::I64Mul:
        case Opcode::F32Mul:
        case Opcode::F64Mul:
          op = '*';
          break;

        default:
          WABT_UNREACHABLE;
      }

      std::string combination =
          "((" + std::string(GetCTypeName(binexpr->opcode.GetParamType1())) +
          ")" + mini_stack.at(mini_stack.size() - 2) + ")" + op + "((" +
          std::string(GetCTypeName(binexpr->opcode.GetParamType2())) + ")" +
          mini_stack.at(mini_stack.size() - 1) + ")";
      mini_stack.resize(mini_stack.size() - 2);
      mini_stack.push_back(std::move(combination));
    } else {
      // Leaf node (nullary const expression)
      Stream* existing_stream = stream_;
      MemoryStream terminal_stream;
      stream_ = &terminal_stream;
      WriteInitExprTerminal(&expr);
      const auto& buf = terminal_stream.output_buffer();
      mini_stack.emplace_back(reinterpret_cast<const char*>(buf.data.data()),
                              buf.data.size());
      stream_ = existing_stream;
    }
  }

  if (mini_stack.size() != 1) {
    WABT_UNREACHABLE;
  }

  Write(mini_stack.front());
}